

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O0

int compArgStr(char *str,char *arg,int min)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ushort **ppuVar4;
  char a;
  int iStack_28;
  char s;
  int max;
  int i;
  int min_local;
  char *arg_local;
  char *str_local;
  
  if ((str == (char *)0x0) || (arg == (char *)0x0)) {
    str_local._4_4_ = 0;
  }
  else {
    sVar3 = strlen(arg);
    for (iStack_28 = 0; iStack_28 < (int)sVar3; iStack_28 = iStack_28 + 1) {
      iVar2 = toupper((int)str[iStack_28]);
      cVar1 = (char)iVar2;
      iVar2 = toupper((int)arg[iStack_28]);
      if ((min <= iStack_28) &&
         ((((cVar1 == '\0' || (cVar1 == '.')) || (cVar1 == '+')) ||
          ((cVar1 == '-' || (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)cVar1] & 0x800) != 0))))))
      break;
      if (cVar1 != (char)iVar2) {
        iStack_28 = 0;
        break;
      }
    }
    str_local._4_4_ = iStack_28;
  }
  return str_local._4_4_;
}

Assistant:

int compArgStr(char *str, char *arg, int min) {
   int i, max;
   char s, a;

   if (!str || !arg) return 0;

   max = strlen(arg);

   for(i=0; i<max; i++) {
      s = toupper(str[i]);
      a = toupper(arg[i]);

      if (i >= min && (s == '\0' || s == '.'
	 || s == '+' || s == '-' || isdigit(s))) {
	 break; /* good ending point */
      }
      else if (s != a) {
	 i = 0; /* failed to match */
	 break;
      }
   }

   return i;
}